

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O3

_Bool mon_select(monster_race *race)

{
  byte bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *pcVar6;
  bitflag *flags;
  
  bVar1 = player->themed_level;
  wVar3 = themed_level_index("Elemental");
  if (wVar3 != (uint)bVar1) {
    bVar1 = player->themed_level;
    wVar3 = themed_level_index("Estolad");
    if (((wVar3 != (uint)bVar1) ||
        (_Var2 = flag_has_dbg(race->flags,0xc,0x24,"race->flags","RF_PLAYER"), _Var2)) &&
       ((base_d_char[0] == '\0' ||
        (pcVar5 = strchr(base_d_char,race->base->d_char), pcVar5 != (char *)0x0)))) {
      if (select_current_level < L'(') {
        _Var2 = flag_has_dbg(race->flags,0xc,0x49,"race->flags","RF_UNDEAD");
        if ((_Var2) &&
           (_Var2 = flag_has_dbg(race->flags,0xc,0x33,"race->flags","RF_INVISIBLE"), _Var2)) {
          return false;
        }
      }
      _Var2 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
      if ((!_Var2) || ((allow_unique == true && (uVar4 = Rand_div(5), uVar4 == 0)))) {
        return true;
      }
    }
    return false;
  }
  pcVar5 = my_stristr(race->base->name,"demon");
  if (pcVar5 != (char *)0x0) {
    return true;
  }
  pcVar5 = race->name;
  pcVar6 = strstr(pcVar5,"Fire");
  if (pcVar6 != (char *)0x0) {
    return true;
  }
  pcVar6 = strstr(pcVar5,"Hell");
  if (pcVar6 != (char *)0x0) {
    return true;
  }
  pcVar6 = strstr(pcVar5,"Frost");
  if (pcVar6 == (char *)0x0) {
    pcVar6 = strstr(pcVar5,"Cold");
    if (pcVar6 != (char *)0x0) {
      return true;
    }
    pcVar6 = strstr(pcVar5,"Acid");
    if (pcVar6 != (char *)0x0) {
      return true;
    }
    pcVar6 = strstr(pcVar5,"Water");
    if (pcVar6 != (char *)0x0) {
      return true;
    }
    pcVar5 = strstr(pcVar5,"Energy");
    if (pcVar5 == (char *)0x0) {
      flags = race->spell_flags;
      _Var2 = flag_has_dbg(flags,0xc,7,"race->spell_flags","RSF_BR_ACID");
      if (_Var2) {
        return true;
      }
      _Var2 = flag_has_dbg(flags,0xc,8,"race->spell_flags","RSF_BR_ELEC");
      if (!_Var2) {
        _Var2 = flag_has_dbg(flags,0xc,9,"race->spell_flags","RSF_BR_FIRE");
        if (!_Var2) {
          _Var2 = flag_has_dbg(flags,0xc,10,"race->spell_flags","RSF_BR_COLD");
          return _Var2;
        }
        return true;
      }
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

static bool mon_select(struct monster_race *race)
{
	/* Special case: Elemental war themed level. */
	if (player->themed_level == themed_level_index("Elemental")) {
		return (vault_aux_elemental(race));
	}

	/* Special case: Estolad themed level. */
	if (player->themed_level == themed_level_index("Estolad")) {
		if (!rf_has(race->flags, RF_PLAYER))
			return false;
	}

	/* Require that the monster symbol be correct. */
	if (base_d_char[0] != '\0') {
		if (strchr(base_d_char, race->base->d_char) == 0)
			return (false);
	}

	/* No invisible undead until deep. */
	if (select_current_level < 40 && rf_has(race->flags, RF_UNDEAD)
			&& rf_has(race->flags, RF_INVISIBLE))
		return (false);

	/* Usually decline unique monsters. */
	if (rf_has(race->flags, RF_UNIQUE)) {
		if (!allow_unique)
			return (false);
		else if (randint0(5) != 0)
			return (false);
	}

	/* Okay */
	return (true);
}